

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flecs.hpp
# Opt level: O2

int flecs::_::component_info<Rocket_*>::init(EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  int iVar1;
  char *pcVar2;
  char in_DL;
  ecs_entity_t in_RSI;
  bool condition;
  
  if (component_info<Rocket*>::s_id == 0) {
    pcVar2 = ecs_get_path_w_sep((ecs_world_t *)ctx,0,in_RSI,0,".",(char *)0x0);
    component_info<Rocket*>::s_id = in_RSI;
    std::__cxx11::string::assign((char *)&component_info<Rocket*>::s_name_abi_cxx11_);
    component_info<Rocket*>::s_allow_tag = in_DL;
    iVar1 = (*ecs_os_api.free_)(pcVar2);
    return iVar1;
  }
  _ecs_assert(component_info<Rocket*>::s_name_abi_cxx11_ != 0,0xc,(char *)0x0,
              "s_name.c_str() != nullptr",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/include/flecs/flecs.hpp"
              ,0xd79);
  if (component_info<Rocket*>::s_name_abi_cxx11_ == 0) {
    __assert_fail("s_name.c_str() != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/include/flecs/flecs.hpp"
                  ,0xd79,
                  "static void flecs::_::component_info<Rocket *>::init(world_t *, entity_t, bool) [T = Rocket *]"
                 );
  }
  condition = component_info<Rocket*>::s_id == in_RSI;
  pcVar2 = name_helper<Rocket_*>::name();
  _ecs_assert(condition,0x2d,pcVar2,"s_id == entity",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/include/flecs/flecs.hpp"
              ,0xd7d);
  if (component_info<Rocket*>::s_id != in_RSI) {
    __assert_fail("s_id == entity",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/include/flecs/flecs.hpp"
                  ,0xd7d,
                  "static void flecs::_::component_info<Rocket *>::init(world_t *, entity_t, bool) [T = Rocket *]"
                 );
  }
  _ecs_assert(component_info<Rocket*>::s_allow_tag == in_DL,0xc,(char *)0x0,
              "allow_tag == s_allow_tag",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/include/flecs/flecs.hpp"
              ,0xd7f);
  if (component_info<Rocket*>::s_allow_tag == in_DL) {
    return extraout_EAX;
  }
  __assert_fail("allow_tag == s_allow_tag",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/include/flecs/flecs.hpp"
                ,0xd7f,
                "static void flecs::_::component_info<Rocket *>::init(world_t *, entity_t, bool) [T = Rocket *]"
               );
}

Assistant:

static void init(world_t* world, entity_t entity, bool allow_tag = true) {
        // If an identifier was already set, check for consistency
        if (s_id) {
            // If an identifier was registered, a name should've been registered
            // as well.
            ecs_assert(s_name.c_str() != nullptr, ECS_INTERNAL_ERROR, NULL);

            // A component cannot be registered using a different identifier.
            ecs_assert(s_id == entity, ECS_INCONSISTENT_COMPONENT_ID, 
                _::name_helper<T>::name());

            ecs_assert(allow_tag == s_allow_tag, ECS_INTERNAL_ERROR, NULL);

            // Component was already registered and data is consistent with new
            // identifier, so nothing else to be done.
            return;
        }

        // Component wasn't registered yet, set the values. Register component
        // name as the fully qualified flecs path.
        char *path = ecs_get_fullpath(world, entity);
        s_id = entity;
        s_name = path;
        s_allow_tag = allow_tag;

        // s_name is an std::string, so it will have made a copy
        ecs_os_free(path);
    }